

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SizePolicy.cpp
# Opt level: O3

uint PrimePolicy::GetPrime(uint min,int *modFunctionIndex)

{
  bool bVar1;
  int i;
  long lVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  ulong uVar6;
  
  if (min == 0) {
    uVar5 = 0x11;
    lVar2 = 3;
LAB_00691c1f:
    *modFunctionIndex = (int)lVar2;
  }
  else {
    puVar4 = primes;
    lVar2 = 0;
    do {
      uVar5 = *puVar4;
      if (min <= uVar5) goto LAB_00691c1f;
      lVar2 = lVar2 + 1;
      puVar4 = puVar4 + 1;
    } while (lVar2 != 0x4b);
    *modFunctionIndex = 0x4b;
    uVar3 = min | 1;
    uVar5 = min;
    if ((min | 1) < 0x7fffffff) {
      while (uVar5 = uVar3, 2 < (int)(long)SQRT((float)(int)uVar3)) {
        uVar6 = 3;
        while ((int)((ulong)uVar3 % uVar6) != 0) {
          uVar5 = (int)uVar6 + 2;
          uVar6 = (ulong)uVar5;
          if ((int)(long)SQRT((float)(int)uVar3) < (int)uVar5) {
            return uVar3;
          }
        }
        bVar1 = 0x7ffffffc < uVar3;
        uVar3 = uVar3 + 2;
        if (bVar1) {
          return min;
        }
      }
    }
  }
  return uVar5;
}

Assistant:

uint
PrimePolicy::GetPrime(uint min, int *modFunctionIndex)
{
    if (min <= 0)
    {
        *modFunctionIndex = 3;
        AssertMsg(primes[3] == 17, "Update modFunctionIndex for 17");
        return 17;
    }

    for (int i = 0; i < sizeof(primes)/sizeof(uint); i++)
    {
        uint prime = primes[i];
        if (prime >= min)
        {
            *modFunctionIndex = i;
            return prime;
        }
    }

    *modFunctionIndex = UNKNOWN_MOD_INDEX;
    //outside of our predefined table.
    //compute the hard way.
    for (uint i = (min | 1); i < 0x7FFFFFFF; i += 2)
    {
        if (IsPrime(i))
        {
            return i;
        }
    }
    return min;
}